

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O2

int count_dups<std::vector<int,std::allocator<int>>>
              (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *t)

{
  pointer pvVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  undefined8 uStack_60;
  undefined1 auStack_58 [8];
  ulong local_50;
  ulong local_48;
  undefined1 *local_40;
  int local_34;
  
  uStack_60 = 0x18;
  uVar4 = ((long)(t->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
          (long)(t->
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start) / 0x18;
  lVar2 = -(uVar4 + 0xf & 0xfffffffffffffff0);
  iVar7 = (int)uVar4;
  uVar6 = 0;
  local_40 = auStack_58 + lVar2;
  *(undefined8 *)(auStack_58 + lVar2 + -8) = 0x108a27;
  memset(auStack_58 + lVar2,0,(long)iVar7);
  uVar5 = 0;
  if (0 < iVar7) {
    uVar5 = uVar4 & 0xffffffff;
  }
  local_34 = 0;
  local_48 = uVar5;
  while( true ) {
    if (uVar6 == uVar5) {
      return local_34;
    }
    local_50 = uVar6;
    uVar4 = uVar6;
    if (local_40[uVar6] == '\0') break;
LAB_00108a97:
    uVar6 = local_50 + 1;
  }
  do {
    lVar8 = uVar4 * 0x18;
    do {
      uVar5 = local_48;
      if (iVar7 <= (int)uVar4 + 1) goto LAB_00108a97;
      pvVar1 = (t->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)(auStack_58 + lVar2 + -8) = 0x108a76;
      bVar3 = std::operator==(pvVar1 + uVar6,
                              (vector<int,_std::allocator<int>_> *)
                              ((long)&pvVar1[1].super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data + lVar8));
      uVar4 = uVar4 + 1;
      lVar8 = lVar8 + 0x18;
    } while (!bVar3);
    local_34 = local_34 + 1;
    local_40[uVar4] = 1;
  } while( true );
}

Assistant:

int count_dups(std::vector<T> &t)
{
    int dups = 0;
    int N = t.size();
    STACKALLOC(bool, mark, t.size());
    memset(mark, 0, N);
    for(int i=0; i<N; ++i) {
        if(mark[i])
            continue;
        for(int j=i+1; j<N; ++j) {
            if(t[i] == t[j]) {
                dups++;
                mark[j] = true;
            }
        }
    }
    return dups;
}